

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergeFrom
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *initial_value;
  string *psVar4;
  void **ppvVar5;
  Version *this_00;
  int iVar6;
  Version *from_00;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar6 = (from->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->file_to_generate_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->file_to_generate_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar6,
               ((this->file_to_generate_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
    (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  iVar6 = (from->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->proto_file_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
              (&(this->proto_file_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar6,
               ((this->proto_file_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
    (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      initial_value = (from->parameter_).ptr_;
      psVar4 = (this->parameter_).ptr_;
      if (psVar4 != initial_value) {
        if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->parameter_,initial_value);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar4);
        }
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->compiler_version_;
      if (this_00 == (Version *)0x0) {
        this_00 = Arena::CreateMaybeMessage<google::protobuf::compiler::Version>((Arena *)0x0);
        this->compiler_version_ = this_00;
      }
      from_00 = (Version *)_Version_default_instance_;
      if (from->compiler_version_ != (Version *)0x0) {
        from_00 = from->compiler_version_;
      }
      Version::MergeFrom(this_00,from_00);
      return;
    }
  }
  return;
}

Assistant:

void CodeGeneratorRequest::MergeFrom(const CodeGeneratorRequest& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorRequest)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  file_to_generate_.MergeFrom(from.file_to_generate_);
  proto_file_.MergeFrom(from.proto_file_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _has_bits_[0] |= 0x00000001u;
      parameter_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.parameter_);
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_compiler_version()->PROTOBUF_NAMESPACE_ID::compiler::Version::MergeFrom(from._internal_compiler_version());
    }
  }
}